

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

void __thiscall
estl::vector_s<int,10ul>::
assign<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (vector_s<int,10ul> *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  reference piVar4;
  long lVar5;
  pointer insert_ptr;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> it;
  size_type i;
  size_type diff;
  vector_s<int,_10UL> *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  this_local = (vector_s<int,_10UL> *)last._M_current;
  last_local = first;
  sVar3 = check_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (this,first,last);
  it._M_current = (int *)0x0;
  insert_ptr = last_local._M_current;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &insert_ptr,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &this_local);
    if (!bVar2) break;
    lVar1 = *(long *)(this + 0x30);
    lVar5 = (long)it._M_current * 4;
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &insert_ptr);
    *(int *)(lVar1 + lVar5) = *piVar4;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&insert_ptr);
    it._M_current = it._M_current + 1;
  }
  *(size_type *)this = sVar3;
  return;
}

Assistant:

void assign(InputIt first, InputIt last)
    {
        const size_type diff = check_range(first, last);
        size_type i = 0u;
        for (InputIt it = first; it != last; ++it, ++i) {
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(*it);
        }
        size_ = diff;
    }